

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcSimpleProperty::~IfcSimpleProperty(IfcSimpleProperty *this)

{
  _func_int *p_Var1;
  code *pcVar2;
  _func_int *p_Var3;
  
  p_Var3 = (this->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
           _vptr_ObjectHelper[-3];
  p_Var1 = (_func_int *)
           ((long)&(this->super_IfcProperty).
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>._vptr_ObjectHelper
           + (long)p_Var3);
  pcVar2 = p_Var3 + 0x10 + (long)&(this->super_IfcProperty).Description.ptr._M_dataplus;
  *(undefined8 *)(pcVar2 + -0x40) = 0x8fa1a0;
  *(undefined8 *)(pcVar2 + 0x28) = 0x8fa1c8;
  if (*(code **)(pcVar2 + -0x10) != pcVar2) {
    operator_delete(*(code **)(pcVar2 + -0x10));
  }
  if (*(code **)(p_Var1 + 0x10) != p_Var1 + 0x20) {
    operator_delete(*(code **)(p_Var1 + 0x10));
  }
  operator_delete(p_Var1);
  return;
}

Assistant:

IfcSimpleProperty() : Object("IfcSimpleProperty") {}